

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AtomicFile.cpp
# Opt level: O0

void __thiscall AtomicFile::AtomicFile(AtomicFile *this,string *path)

{
  Path local_58;
  string *local_18;
  string *path_local;
  AtomicFile *this_local;
  
  local_18 = path;
  path_local = (string *)this;
  Path::Path(&local_58,path);
  AtomicFile(this,&local_58);
  Path::~Path(&local_58);
  return;
}

Assistant:

AtomicFile::AtomicFile (std::string path) : AtomicFile (Path (path))
{
}